

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O2

void tdefl_optimize_huffman_table
               (tdefl_compressor *d,int table_num,int table_len,int code_size_limit,int static_table
               )

{
  mz_uint8 (*pamVar1) [288];
  byte bVar2;
  mz_uint16 mVar3;
  bool bVar4;
  mz_uint8 *pmVar5;
  bool bVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  tdefl_sym_freq *ptVar10;
  mz_uint16 *pmVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  mz_uint mVar17;
  tdefl_sym_freq *ptVar18;
  long lVar19;
  long lVar20;
  ushort uVar21;
  uint uVar22;
  uint uVar23;
  tdefl_sym_freq *ptVar24;
  ushort uVar25;
  uint uVar26;
  mz_uint *__s;
  int num_codes [33];
  mz_uint next_code [33];
  uint local_1138 [256];
  tdefl_sym_freq syms0 [288];
  uint auStack_8b8 [256];
  tdefl_sym_freq syms1 [288];
  
  num_codes[0x20] = 0;
  num_codes[0] = 0;
  num_codes[1] = 0;
  num_codes[2] = 0;
  num_codes[3] = 0;
  num_codes[4] = 0;
  num_codes[5] = 0;
  num_codes[6] = 0;
  num_codes[7] = 0;
  num_codes[8] = 0;
  num_codes[9] = 0;
  num_codes[10] = 0;
  num_codes[0xb] = 0;
  num_codes[0xc] = 0;
  num_codes[0xd] = 0;
  num_codes[0xe] = 0;
  num_codes[0xf] = 0;
  num_codes[0x10] = 0;
  num_codes[0x11] = 0;
  num_codes[0x12] = 0;
  num_codes[0x13] = 0;
  num_codes[0x14] = 0;
  num_codes[0x15] = 0;
  num_codes[0x16] = 0;
  num_codes[0x17] = 0;
  num_codes[0x18] = 0;
  num_codes[0x19] = 0;
  num_codes[0x1a] = 0;
  num_codes[0x1b] = 0;
  num_codes[0x1c] = 0;
  num_codes[0x1d] = 0;
  num_codes[0x1e] = 0;
  num_codes[0x1f] = 0;
  uVar7 = table_len >> 0x1f;
  if (static_table == 0) {
    uVar13 = 0;
    for (uVar15 = 0; (~uVar7 & table_len) != uVar15; uVar15 = uVar15 + 1) {
      mVar3 = d->m_huff_count[(uint)table_num][uVar15];
      if (mVar3 != 0) {
        syms0[(int)uVar13].m_key = mVar3;
        syms0[(int)uVar13].m_sym_index = (mz_uint16)uVar15;
        uVar13 = uVar13 + 1;
      }
    }
    __s = next_code;
    memset(__s,0,0x800);
    for (uVar15 = 0; uVar13 != uVar15; uVar15 = uVar15 + 1) {
      uVar25 = syms0[uVar15].m_key;
      next_code[(byte)uVar25] = next_code[(byte)uVar25] + 1;
      local_1138[uVar25 >> 8] = local_1138[uVar25 >> 8] + 1;
    }
    lVar8 = 2;
    bVar6 = local_1138[0] == uVar13;
    do {
      bVar4 = bVar6;
      lVar20 = lVar8;
      uVar26 = 0;
      lVar8 = 1;
      bVar6 = false;
    } while (bVar4);
    ptVar24 = syms1;
    ptVar18 = syms0;
    for (lVar8 = 0; ptVar10 = ptVar24, lVar8 != lVar20; lVar8 = lVar8 + 1) {
      uVar22 = 0;
      for (lVar19 = 0; lVar19 != 0x100; lVar19 = lVar19 + 1) {
        auStack_8b8[lVar19] = uVar22;
        uVar22 = uVar22 + __s[lVar19];
      }
      for (uVar15 = 0; uVar13 != uVar15; uVar15 = uVar15 + 1) {
        uVar23 = ptVar18[uVar15].m_key >> (uVar26 & 0x1f) & 0xff;
        uVar22 = auStack_8b8[uVar23];
        auStack_8b8[uVar23] = uVar22 + 1;
        ptVar10[uVar22] = ptVar18[uVar15];
      }
      uVar26 = uVar26 + 8;
      __s = __s + 0x100;
      ptVar24 = ptVar18;
      ptVar18 = ptVar10;
    }
    if (uVar13 != 0) {
      if (uVar13 == 1) {
        ptVar18->m_key = 1;
      }
      else {
        ptVar18->m_key = ptVar18->m_key + ptVar18[1].m_key;
        iVar16 = uVar13 - 1;
        iVar9 = 2;
        iVar14 = 0;
        for (lVar8 = 1; lVar8 < iVar16; lVar8 = lVar8 + 1) {
          lVar20 = (long)iVar14;
          if ((iVar9 < (int)uVar13) &&
             (lVar19 = (long)iVar9, ptVar18[lVar19].m_key <= ptVar18[lVar20].m_key)) {
            iVar9 = iVar9 + 1;
            ptVar18[lVar8].m_key = ptVar18[lVar19].m_key;
          }
          else {
            iVar14 = iVar14 + 1;
            ptVar18[lVar8].m_key = ptVar18[lVar20].m_key;
            ptVar18[lVar20].m_key = (mz_uint16)lVar8;
            lVar20 = (long)iVar14;
          }
          if (iVar9 < (int)uVar13) {
            if (lVar20 < lVar8) {
              uVar25 = ptVar18[lVar20].m_key;
              uVar21 = ptVar18[iVar9].m_key;
              if (uVar25 < uVar21) goto LAB_00128f16;
            }
            else {
              uVar21 = ptVar18[iVar9].m_key;
            }
            ptVar18[lVar8].m_key = ptVar18[lVar8].m_key + uVar21;
            iVar9 = iVar9 + 1;
          }
          else {
            uVar25 = ptVar18[lVar20].m_key;
LAB_00128f16:
            ptVar18[lVar8].m_key = ptVar18[lVar8].m_key + uVar25;
            iVar14 = iVar14 + 1;
            ptVar18[lVar20].m_key = (mz_uint16)lVar8;
          }
        }
        ptVar18[(long)(int)uVar13 + -2].m_key = 0;
        uVar15 = (ulong)(uVar13 - 2);
        for (uVar26 = uVar13 - 3; -1 < (int)uVar26; uVar26 = uVar26 - 1) {
          ptVar18[uVar26].m_key = ptVar18[ptVar18[uVar26].m_key].m_key + 1;
        }
        uVar26 = 0;
        iVar9 = 1;
        while (iVar9 != 0) {
          uVar23 = (uint)uVar15;
          uVar22 = 0xffffffff;
          if ((int)uVar23 < -1) {
            uVar22 = uVar23;
          }
          for (iVar14 = 0; iVar14 != uVar23 - uVar22; iVar14 = iVar14 + 1) {
            if (uVar26 != ptVar18[uVar15].m_key) goto LAB_00128fa3;
            uVar15 = (ulong)((int)uVar15 - 1);
          }
          uVar15 = (ulong)uVar22;
          iVar14 = uVar23 - uVar22;
LAB_00128fa3:
          ptVar24 = ptVar18 + iVar16;
          for (; iVar14 < iVar9; iVar9 = iVar9 + -1) {
            ptVar24->m_key = (mz_uint16)uVar26;
            iVar16 = iVar16 + -1;
            ptVar24 = ptVar24 + -1;
          }
          uVar26 = uVar26 + 1;
          iVar9 = iVar14 * 2;
        }
      }
    }
    for (uVar15 = 0; (~((int)uVar13 >> 0x1f) & uVar13) != uVar15; uVar15 = uVar15 + 1) {
      num_codes[ptVar18[uVar15].m_key] = num_codes[ptVar18[uVar15].m_key] + 1;
    }
    if (1 < (int)uVar13) {
      uVar15 = (ulong)(uint)code_size_limit;
      for (lVar8 = (long)code_size_limit; lVar8 < 0x20; lVar8 = lVar8 + 1) {
        num_codes[uVar15] = num_codes[uVar15] + num_codes[lVar8 + 1];
      }
      uVar22 = 0;
      uVar26 = 0;
      for (uVar12 = uVar15; 0 < (int)uVar12; uVar12 = uVar12 - 1) {
        uVar23 = uVar22 & 0x1f;
        uVar22 = uVar22 + 1;
        uVar26 = uVar26 + (num_codes[uVar12] << uVar23);
      }
      for (; 1L << (uVar15 & 0x3f) != (ulong)uVar26; uVar26 = uVar26 - 1) {
        num_codes[uVar15] = num_codes[uVar15] + -1;
        uVar12 = uVar15;
        do {
          if ((int)uVar12 < 2) goto LAB_00128e9a;
          lVar8 = uVar12 - 1;
          uVar12 = uVar12 - 1;
        } while (num_codes[lVar8] == 0);
        num_codes[uVar12] = num_codes[lVar8] + -1;
        num_codes[(int)uVar12 + 1U & 0x7fffffff] = num_codes[(int)uVar12 + 1U & 0x7fffffff] + 2;
LAB_00128e9a:
      }
    }
    pmVar5 = d->m_huff_code_sizes[(uint)table_num];
    pmVar5[0xe0] = '\0';
    pmVar5[0xe1] = '\0';
    pmVar5[0xe2] = '\0';
    pmVar5[0xe3] = '\0';
    pmVar5[0xe4] = '\0';
    pmVar5[0xe5] = '\0';
    pmVar5[0xe6] = '\0';
    pmVar5[0xe7] = '\0';
    pmVar5[0xe8] = '\0';
    pmVar5[0xe9] = '\0';
    pmVar5[0xea] = '\0';
    pmVar5[0xeb] = '\0';
    pmVar5[0xec] = '\0';
    pmVar5[0xed] = '\0';
    pmVar5[0xee] = '\0';
    pmVar5[0xef] = '\0';
    pmVar5[0xf0] = '\0';
    pmVar5[0xf1] = '\0';
    pmVar5[0xf2] = '\0';
    pmVar5[0xf3] = '\0';
    pmVar5[0xf4] = '\0';
    pmVar5[0xf5] = '\0';
    pmVar5[0xf6] = '\0';
    pmVar5[0xf7] = '\0';
    pmVar5[0xf8] = '\0';
    pmVar5[0xf9] = '\0';
    pmVar5[0xfa] = '\0';
    pmVar5[0xfb] = '\0';
    pmVar5[0xfc] = '\0';
    pmVar5[0xfd] = '\0';
    pmVar5[0xfe] = '\0';
    pmVar5[0xff] = '\0';
    pmVar5[0x100] = '\0';
    pmVar5[0x101] = '\0';
    pmVar5[0x102] = '\0';
    pmVar5[0x103] = '\0';
    pmVar5[0x104] = '\0';
    pmVar5[0x105] = '\0';
    pmVar5[0x106] = '\0';
    pmVar5[0x107] = '\0';
    pmVar5[0x108] = '\0';
    pmVar5[0x109] = '\0';
    pmVar5[0x10a] = '\0';
    pmVar5[0x10b] = '\0';
    pmVar5[0x10c] = '\0';
    pmVar5[0x10d] = '\0';
    pmVar5[0x10e] = '\0';
    pmVar5[0x10f] = '\0';
    pmVar5[0x110] = '\0';
    pmVar5[0x111] = '\0';
    pmVar5[0x112] = '\0';
    pmVar5[0x113] = '\0';
    pmVar5[0x114] = '\0';
    pmVar5[0x115] = '\0';
    pmVar5[0x116] = '\0';
    pmVar5[0x117] = '\0';
    pmVar5[0x118] = '\0';
    pmVar5[0x119] = '\0';
    pmVar5[0x11a] = '\0';
    pmVar5[0x11b] = '\0';
    pmVar5[0x11c] = '\0';
    pmVar5[0x11d] = '\0';
    pmVar5[0x11e] = '\0';
    pmVar5[0x11f] = '\0';
    pmVar5 = d->m_huff_code_sizes[(uint)table_num];
    pmVar5[0xc0] = '\0';
    pmVar5[0xc1] = '\0';
    pmVar5[0xc2] = '\0';
    pmVar5[0xc3] = '\0';
    pmVar5[0xc4] = '\0';
    pmVar5[0xc5] = '\0';
    pmVar5[0xc6] = '\0';
    pmVar5[199] = '\0';
    pmVar5[200] = '\0';
    pmVar5[0xc9] = '\0';
    pmVar5[0xca] = '\0';
    pmVar5[0xcb] = '\0';
    pmVar5[0xcc] = '\0';
    pmVar5[0xcd] = '\0';
    pmVar5[0xce] = '\0';
    pmVar5[0xcf] = '\0';
    pmVar5[0xd0] = '\0';
    pmVar5[0xd1] = '\0';
    pmVar5[0xd2] = '\0';
    pmVar5[0xd3] = '\0';
    pmVar5[0xd4] = '\0';
    pmVar5[0xd5] = '\0';
    pmVar5[0xd6] = '\0';
    pmVar5[0xd7] = '\0';
    pmVar5[0xd8] = '\0';
    pmVar5[0xd9] = '\0';
    pmVar5[0xda] = '\0';
    pmVar5[0xdb] = '\0';
    pmVar5[0xdc] = '\0';
    pmVar5[0xdd] = '\0';
    pmVar5[0xde] = '\0';
    pmVar5[0xdf] = '\0';
    pmVar5[0xe0] = '\0';
    pmVar5[0xe1] = '\0';
    pmVar5[0xe2] = '\0';
    pmVar5[0xe3] = '\0';
    pmVar5[0xe4] = '\0';
    pmVar5[0xe5] = '\0';
    pmVar5[0xe6] = '\0';
    pmVar5[0xe7] = '\0';
    pmVar5[0xe8] = '\0';
    pmVar5[0xe9] = '\0';
    pmVar5[0xea] = '\0';
    pmVar5[0xeb] = '\0';
    pmVar5[0xec] = '\0';
    pmVar5[0xed] = '\0';
    pmVar5[0xee] = '\0';
    pmVar5[0xef] = '\0';
    pmVar5[0xf0] = '\0';
    pmVar5[0xf1] = '\0';
    pmVar5[0xf2] = '\0';
    pmVar5[0xf3] = '\0';
    pmVar5[0xf4] = '\0';
    pmVar5[0xf5] = '\0';
    pmVar5[0xf6] = '\0';
    pmVar5[0xf7] = '\0';
    pmVar5[0xf8] = '\0';
    pmVar5[0xf9] = '\0';
    pmVar5[0xfa] = '\0';
    pmVar5[0xfb] = '\0';
    pmVar5[0xfc] = '\0';
    pmVar5[0xfd] = '\0';
    pmVar5[0xfe] = '\0';
    pmVar5[0xff] = '\0';
    pmVar5 = d->m_huff_code_sizes[(uint)table_num];
    pmVar5[0x80] = '\0';
    pmVar5[0x81] = '\0';
    pmVar5[0x82] = '\0';
    pmVar5[0x83] = '\0';
    pmVar5[0x84] = '\0';
    pmVar5[0x85] = '\0';
    pmVar5[0x86] = '\0';
    pmVar5[0x87] = '\0';
    pmVar5[0x88] = '\0';
    pmVar5[0x89] = '\0';
    pmVar5[0x8a] = '\0';
    pmVar5[0x8b] = '\0';
    pmVar5[0x8c] = '\0';
    pmVar5[0x8d] = '\0';
    pmVar5[0x8e] = '\0';
    pmVar5[0x8f] = '\0';
    pmVar5[0x90] = '\0';
    pmVar5[0x91] = '\0';
    pmVar5[0x92] = '\0';
    pmVar5[0x93] = '\0';
    pmVar5[0x94] = '\0';
    pmVar5[0x95] = '\0';
    pmVar5[0x96] = '\0';
    pmVar5[0x97] = '\0';
    pmVar5[0x98] = '\0';
    pmVar5[0x99] = '\0';
    pmVar5[0x9a] = '\0';
    pmVar5[0x9b] = '\0';
    pmVar5[0x9c] = '\0';
    pmVar5[0x9d] = '\0';
    pmVar5[0x9e] = '\0';
    pmVar5[0x9f] = '\0';
    pmVar5[0xa0] = '\0';
    pmVar5[0xa1] = '\0';
    pmVar5[0xa2] = '\0';
    pmVar5[0xa3] = '\0';
    pmVar5[0xa4] = '\0';
    pmVar5[0xa5] = '\0';
    pmVar5[0xa6] = '\0';
    pmVar5[0xa7] = '\0';
    pmVar5[0xa8] = '\0';
    pmVar5[0xa9] = '\0';
    pmVar5[0xaa] = '\0';
    pmVar5[0xab] = '\0';
    pmVar5[0xac] = '\0';
    pmVar5[0xad] = '\0';
    pmVar5[0xae] = '\0';
    pmVar5[0xaf] = '\0';
    pmVar5[0xb0] = '\0';
    pmVar5[0xb1] = '\0';
    pmVar5[0xb2] = '\0';
    pmVar5[0xb3] = '\0';
    pmVar5[0xb4] = '\0';
    pmVar5[0xb5] = '\0';
    pmVar5[0xb6] = '\0';
    pmVar5[0xb7] = '\0';
    pmVar5[0xb8] = '\0';
    pmVar5[0xb9] = '\0';
    pmVar5[0xba] = '\0';
    pmVar5[0xbb] = '\0';
    pmVar5[0xbc] = '\0';
    pmVar5[0xbd] = '\0';
    pmVar5[0xbe] = '\0';
    pmVar5[0xbf] = '\0';
    pmVar5 = d->m_huff_code_sizes[(uint)table_num];
    pmVar5[0x40] = '\0';
    pmVar5[0x41] = '\0';
    pmVar5[0x42] = '\0';
    pmVar5[0x43] = '\0';
    pmVar5[0x44] = '\0';
    pmVar5[0x45] = '\0';
    pmVar5[0x46] = '\0';
    pmVar5[0x47] = '\0';
    pmVar5[0x48] = '\0';
    pmVar5[0x49] = '\0';
    pmVar5[0x4a] = '\0';
    pmVar5[0x4b] = '\0';
    pmVar5[0x4c] = '\0';
    pmVar5[0x4d] = '\0';
    pmVar5[0x4e] = '\0';
    pmVar5[0x4f] = '\0';
    pmVar5[0x50] = '\0';
    pmVar5[0x51] = '\0';
    pmVar5[0x52] = '\0';
    pmVar5[0x53] = '\0';
    pmVar5[0x54] = '\0';
    pmVar5[0x55] = '\0';
    pmVar5[0x56] = '\0';
    pmVar5[0x57] = '\0';
    pmVar5[0x58] = '\0';
    pmVar5[0x59] = '\0';
    pmVar5[0x5a] = '\0';
    pmVar5[0x5b] = '\0';
    pmVar5[0x5c] = '\0';
    pmVar5[0x5d] = '\0';
    pmVar5[0x5e] = '\0';
    pmVar5[0x5f] = '\0';
    pmVar5[0x60] = '\0';
    pmVar5[0x61] = '\0';
    pmVar5[0x62] = '\0';
    pmVar5[99] = '\0';
    pmVar5[100] = '\0';
    pmVar5[0x65] = '\0';
    pmVar5[0x66] = '\0';
    pmVar5[0x67] = '\0';
    pmVar5[0x68] = '\0';
    pmVar5[0x69] = '\0';
    pmVar5[0x6a] = '\0';
    pmVar5[0x6b] = '\0';
    pmVar5[0x6c] = '\0';
    pmVar5[0x6d] = '\0';
    pmVar5[0x6e] = '\0';
    pmVar5[0x6f] = '\0';
    pmVar5[0x70] = '\0';
    pmVar5[0x71] = '\0';
    pmVar5[0x72] = '\0';
    pmVar5[0x73] = '\0';
    pmVar5[0x74] = '\0';
    pmVar5[0x75] = '\0';
    pmVar5[0x76] = '\0';
    pmVar5[0x77] = '\0';
    pmVar5[0x78] = '\0';
    pmVar5[0x79] = '\0';
    pmVar5[0x7a] = '\0';
    pmVar5[0x7b] = '\0';
    pmVar5[0x7c] = '\0';
    pmVar5[0x7d] = '\0';
    pmVar5[0x7e] = '\0';
    pmVar5[0x7f] = '\0';
    pamVar1 = d->m_huff_code_sizes + (uint)table_num;
    *(mz_uint8 *)((long)pamVar1 + 0) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 1) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 2) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 3) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 4) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 5) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 6) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 7) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 8) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 9) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 10) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0xb) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0xc) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0xd) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0xe) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0xf) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x10) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x11) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x12) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x13) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x14) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x15) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x16) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x17) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x18) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x19) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x1a) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x1b) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x1c) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x1d) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x1e) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x1f) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x20) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x21) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x22) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x23) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x24) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x25) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x26) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x27) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x28) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x29) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x2a) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x2b) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x2c) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x2d) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x2e) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x2f) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x30) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x31) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x32) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x33) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x34) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x35) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x36) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x37) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x38) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x39) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x3a) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x3b) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x3c) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x3d) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x3e) = '\0';
    *(mz_uint8 *)((long)pamVar1 + 0x3f) = '\0';
    memset(d->m_huff_codes + (uint)table_num,0,0x240);
    for (uVar15 = 1; uVar15 != (~(code_size_limit >> 0x1f) & code_size_limit) + 1;
        uVar15 = uVar15 + 1) {
      pmVar11 = &ptVar18[(long)(int)uVar13 + -1].m_sym_index;
      for (iVar16 = num_codes[uVar15]; 0 < iVar16; iVar16 = iVar16 + -1) {
        uVar25 = *pmVar11;
        uVar13 = uVar13 - 1;
        pmVar11 = pmVar11 + -2;
        d->m_huff_code_sizes[(uint)table_num][uVar25] = (mz_uint8)uVar15;
      }
    }
  }
  else {
    for (uVar15 = 0; (~uVar7 & table_len) != uVar15; uVar15 = uVar15 + 1) {
      num_codes[d->m_huff_code_sizes[(uint)table_num][uVar15]] =
           num_codes[d->m_huff_code_sizes[(uint)table_num][uVar15]] + 1;
    }
  }
  next_code[1] = 0;
  mVar17 = 0;
  for (lVar8 = 2; lVar8 <= code_size_limit; lVar8 = lVar8 + 1) {
    mVar17 = (mVar17 + num_codes[lVar8 + -1]) * 2;
    next_code[lVar8] = mVar17;
  }
  for (uVar15 = 0; uVar15 != (~uVar7 & table_len); uVar15 = uVar15 + 1) {
    bVar2 = d->m_huff_code_sizes[(uint)table_num][uVar15];
    uVar13 = (uint)bVar2;
    if (bVar2 != 0) {
      mVar17 = next_code[bVar2];
      next_code[bVar2] = mVar17 + 1;
      iVar16 = 0;
      for (; 0 < (int)uVar13; uVar13 = uVar13 - 1) {
        uVar26 = mVar17 & 1;
        mVar17 = mVar17 >> 1;
        iVar16 = uVar26 + iVar16 * 2;
      }
      d->m_huff_codes[(uint)table_num][uVar15] = (mz_uint16)iVar16;
    }
  }
  return;
}

Assistant:

static void
tdefl_optimize_huffman_table(tdefl_compressor* d, int table_num, int table_len, int code_size_limit, int static_table) {

    int i, j, l, num_codes[1 + TDEFL_MAX_SUPPORTED_HUFF_CODESIZE];
    mz_uint next_code[TDEFL_MAX_SUPPORTED_HUFF_CODESIZE + 1];
    MZ_CLEAR_OBJ(num_codes);
    if (static_table) {
        for (i = 0; i < table_len; i++)
            num_codes[d->m_huff_code_sizes[table_num][i]]++;
    }
    else {
        tdefl_sym_freq syms0[TDEFL_MAX_HUFF_SYMBOLS], syms1[TDEFL_MAX_HUFF_SYMBOLS], * pSyms;
        int num_used_syms = 0;
        const mz_uint16* pSym_count = &d->m_huff_count[table_num][0];
        for (i = 0; i < table_len; i++)
            if (pSym_count[i]) {
                syms0[num_used_syms].m_key = (mz_uint16)pSym_count[i];
                syms0[num_used_syms++].m_sym_index = (mz_uint16)i;
            }

        pSyms = tdefl_radix_sort_syms(num_used_syms, syms0, syms1);
        tdefl_calculate_minimum_redundancy(pSyms, num_used_syms);

        for (i = 0; i < num_used_syms; i++)
            num_codes[pSyms[i].m_key]++;

        tdefl_huffman_enforce_max_code_size(num_codes, num_used_syms, code_size_limit);

        MZ_CLEAR_OBJ(d->m_huff_code_sizes[table_num]);
        MZ_CLEAR_OBJ(d->m_huff_codes[table_num]);
        for (i = 1, j = num_used_syms; i <= code_size_limit; i++)
            for (l = num_codes[i]; l > 0; l--)
                d->m_huff_code_sizes[table_num][pSyms[--j].m_sym_index] = (mz_uint8)(i);
    }

    next_code[1] = 0;
    for (j = 0, i = 2; i <= code_size_limit; i++)
        next_code[i] = j = ((j + num_codes[i - 1]) << 1);

    for (i = 0; i < table_len; i++) {
        mz_uint rev_code = 0, code, code_size;
        if ((code_size = d->m_huff_code_sizes[table_num][i]) == 0)
            continue;
        code = next_code[code_size]++;
        for (l = code_size; l > 0; l--, code >>= 1)
            rev_code = (rev_code << 1) | (code & 1);
        d->m_huff_codes[table_num][i] = (mz_uint16)rev_code;
    }
}